

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_name.cc
# Opt level: O0

int x509_name_encode(X509_NAME *a)

{
  stack_st_STACK_OF_X509_NAME_ENTRY *psVar1;
  int iVar2;
  stack_st_STACK_OF_X509_NAME_ENTRY *psVar3;
  size_t sVar4;
  undefined4 extraout_var;
  ASN1_VALUE *local_58;
  ASN1_VALUE *intname_val;
  stack_st_STACK_OF_X509_NAME_ENTRY *intname;
  size_t i;
  X509_NAME_ENTRY *pXStack_38;
  int set;
  X509_NAME_ENTRY *entry;
  stack_st_X509_NAME_ENTRY *entries;
  uchar *p;
  X509_NAME *pXStack_18;
  int len;
  X509_NAME *a_local;
  
  entry = (X509_NAME_ENTRY *)0x0;
  i._4_4_ = -1;
  pXStack_18 = a;
  intname_val = (ASN1_VALUE *)sk_STACK_OF_X509_NAME_ENTRY_new_null();
  if (intname_val != (ASN1_VALUE *)0x0) {
    for (intname = (stack_st_STACK_OF_X509_NAME_ENTRY *)0x0; psVar1 = intname,
        psVar3 = (stack_st_STACK_OF_X509_NAME_ENTRY *)sk_X509_NAME_ENTRY_num(pXStack_18->entries),
        psVar1 < psVar3; intname = intname + 1) {
      pXStack_38 = sk_X509_NAME_ENTRY_value(pXStack_18->entries,(size_t)intname);
      if (pXStack_38->set != i._4_4_) {
        entry = (X509_NAME_ENTRY *)sk_X509_NAME_ENTRY_new_null();
        if (entry == (X509_NAME_ENTRY *)0x0) goto LAB_00238886;
        sVar4 = sk_STACK_OF_X509_NAME_ENTRY_push
                          ((stack_st_STACK_OF_X509_NAME_ENTRY *)intname_val,
                           (STACK_OF_X509_NAME_ENTRY *)entry);
        if (sVar4 == 0) {
          sk_X509_NAME_ENTRY_free((stack_st_X509_NAME_ENTRY *)entry);
          goto LAB_00238886;
        }
        i._4_4_ = pXStack_38->set;
      }
      sVar4 = sk_X509_NAME_ENTRY_push((stack_st_X509_NAME_ENTRY *)entry,pXStack_38);
      if (sVar4 == 0) goto LAB_00238886;
    }
    local_58 = intname_val;
    p._4_4_ = ASN1_item_ex_i2d((ASN1_VALUE **)&local_58,(uchar **)0x0,
                               (ASN1_ITEM *)&X509_NAME_INTERNAL_it,-1,0);
    if ((0 < p._4_4_) &&
       (iVar2 = BUF_MEM_grow((BUF_MEM *)pXStack_18->bytes,(long)p._4_4_),
       CONCAT44(extraout_var,iVar2) != 0)) {
      entries = (stack_st_X509_NAME_ENTRY *)pXStack_18->bytes->data;
      iVar2 = ASN1_item_ex_i2d((ASN1_VALUE **)&local_58,(uchar **)&entries,
                               (ASN1_ITEM *)&X509_NAME_INTERNAL_it,-1,0);
      if (0 < iVar2) {
        sk_STACK_OF_X509_NAME_ENTRY_pop_free
                  ((stack_st_STACK_OF_X509_NAME_ENTRY *)intname_val,local_sk_X509_NAME_ENTRY_free);
        pXStack_18->modified = 0;
        return 1;
      }
    }
  }
LAB_00238886:
  sk_STACK_OF_X509_NAME_ENTRY_pop_free
            ((stack_st_STACK_OF_X509_NAME_ENTRY *)intname_val,local_sk_X509_NAME_ENTRY_free);
  return 0;
}

Assistant:

static int x509_name_encode(X509_NAME *a) {
  int len;
  unsigned char *p;
  STACK_OF(X509_NAME_ENTRY) *entries = NULL;
  X509_NAME_ENTRY *entry;
  int set = -1;
  size_t i;
  STACK_OF(STACK_OF_X509_NAME_ENTRY) *intname =
      sk_STACK_OF_X509_NAME_ENTRY_new_null();

  {
    if (!intname) {
      goto err;
    }
    for (i = 0; i < sk_X509_NAME_ENTRY_num(a->entries); i++) {
      entry = sk_X509_NAME_ENTRY_value(a->entries, i);
      if (entry->set != set) {
        entries = sk_X509_NAME_ENTRY_new_null();
        if (!entries) {
          goto err;
        }
        if (!sk_STACK_OF_X509_NAME_ENTRY_push(intname, entries)) {
          sk_X509_NAME_ENTRY_free(entries);
          goto err;
        }
        set = entry->set;
      }
      if (!sk_X509_NAME_ENTRY_push(entries, entry)) {
        goto err;
      }
    }
    ASN1_VALUE *intname_val = (ASN1_VALUE *)intname;
    len =
        ASN1_item_ex_i2d(&intname_val, NULL, ASN1_ITEM_rptr(X509_NAME_INTERNAL),
                         /*tag=*/-1, /*aclass=*/0);
    if (len <= 0) {
      goto err;
    }
    if (!BUF_MEM_grow(a->bytes, len)) {
      goto err;
    }
    p = (unsigned char *)a->bytes->data;
    if (ASN1_item_ex_i2d(&intname_val, &p, ASN1_ITEM_rptr(X509_NAME_INTERNAL),
                         /*tag=*/-1, /*aclass=*/0) <= 0) {
      goto err;
    }
    sk_STACK_OF_X509_NAME_ENTRY_pop_free(intname,
                                         local_sk_X509_NAME_ENTRY_free);
    a->modified = 0;
    return 1;
  }

err:
  sk_STACK_OF_X509_NAME_ENTRY_pop_free(intname, local_sk_X509_NAME_ENTRY_free);
  return 0;
}